

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::lift_genvar_instances(Generator *top)

{
  undefined1 local_58 [8];
  LiftGenVarInstanceVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  LiftGenVarInstanceVisitor::LiftGenVarInstanceVisitor((LiftGenVarInstanceVisitor *)local_58);
  IRVisitor::visit_generator_root
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  LiftGenVarInstanceVisitor::~LiftGenVarInstanceVisitor((LiftGenVarInstanceVisitor *)local_58);
  return;
}

Assistant:

void lift_genvar_instances(Generator* top) {
    LiftGenVarInstanceVisitor visitor;
    // only local to the current generator so we can run it in parallel
    visitor.visit_generator_root(top);
}